

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

void getPossibleBiomesForLimits(char *ids,int mc,int (*limits) [2])

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int id;
  
  id = 0;
  memset(ids,0,0x100);
  do {
    iVar1 = isOverworld(mc,id);
    if (iVar1 != 0) {
      piVar2 = getBiomeParaLimits(mc,id);
      if (piVar2 != (int *)0x0) {
        lVar3 = 0;
        do {
          if ((piVar2[lVar3 * 2 + 1] < limits[lVar3][0]) || (limits[lVar3][1] < piVar2[lVar3 * 2]))
          goto LAB_00116bd3;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 6);
        ids[piVar2[-1]] = '\x01';
      }
    }
LAB_00116bd3:
    id = id + 1;
    if (id == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

void getPossibleBiomesForLimits(char ids[256], int mc, int limits[6][2])
{
    int i, j;
    memset(ids, 0, 256*sizeof(char));

    for (i = 0; i < 256; i++)
    {
        if (!isOverworld(mc, i))
            continue;
        const int *bp = getBiomeParaLimits(mc, i);
        if (!bp)
            continue;

        for (j = 0; j < 6; j++)
        {
            if (limits[j][0] > bp[2*j+1] || limits[j][1] < bp[2*j+0])
                break;
        }
        if (j >= 6)
            ids[bp[-1]] = 1;
    }
}